

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
libcellml::Parser::ParserImpl::loadVariable(ParserImpl *this,VariablePtr *variable,XmlNodePtr *node)

{
  IssueImpl *pIVar1;
  element_type *peVar2;
  Variable *pVVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  InterfaceType interfaceType;
  string *this_00;
  XmlAttributePtr attribute;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  IssuePtr issue_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string textNode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  XmlNodePtr childNode;
  IssuePtr issue_2;
  string local_58;
  IssueImpl *local_38;
  
  XmlNode::firstChild((XmlNode *)&childNode);
  while (childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) {
    bVar5 = XmlNode::isText(childNode.
                            super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    if (bVar5) {
      XmlNode::convertToString_abi_cxx11_
                (&textNode,
                 childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                );
      bVar5 = hasNonWhitespaceCharacters(&textNode);
      if (bVar5) {
        Issue::IssueImpl::create();
        pIVar1 = (IssueImpl *)
                 attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr[1].mPimpl;
        XmlNode::attribute_abi_cxx11_
                  (&local_58,
                   (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   ,"name");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_3
                       ,"Variable \'",&local_58);
        std::operator+(&local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue_3
                       ,"\' has an invalid non-whitespace child text element \'");
        std::operator+(&local_98,&local_118,&textNode);
        std::operator+(&local_d8,&local_98,"\'.");
        Issue::IssueImpl::setDescription(pIVar1,&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&issue_3);
        std::__cxx11::string::~string((string *)&local_58);
        AnyCellmlElement::AnyCellmlElementImpl::setVariable
                  ((AnyCellmlElementImpl *)
                   (attribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    [1].mPimpl[5].mXmlAttributePtr)->_private,variable);
        Issue::IssueImpl::setReferenceRule
                  ((IssueImpl *)
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr[1].mPimpl,XML_UNEXPECTED_CHARACTER);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&attribute);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&attribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__cxx11::string::~string((string *)&textNode);
    }
    else {
      bVar5 = XmlNode::isComment(childNode.
                                 super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
      if (!bVar5) {
        Issue::IssueImpl::create();
        pIVar1 = (IssueImpl *)
                 attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr[1].mPimpl;
        if (this->mParsing1XVersion == true) {
          XmlNode::attribute_abi_cxx11_
                    ((string *)&issue_3,
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,"name");
          std::operator+(&local_118,"Variable \'",(string *)&issue_3);
          std::operator+(&local_98,&local_118,"\' ignoring child element \'");
          XmlNode::name_abi_cxx11_
                    (&local_58,
                     childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::operator+(&local_d8,&local_98,&local_58);
          std::operator+(&textNode,&local_d8,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&issue_3);
          Issue::IssueImpl::setLevel
                    ((IssueImpl *)
                     attribute.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     [1].mPimpl,MESSAGE);
        }
        else {
          XmlNode::attribute_abi_cxx11_
                    ((string *)&issue_3,
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,"name");
          std::operator+(&local_118,"Variable \'",(string *)&issue_3);
          std::operator+(&local_98,&local_118,"\' has an invalid child element \'");
          XmlNode::name_abi_cxx11_
                    (&local_58,
                     childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          std::operator+(&local_d8,&local_98,&local_58);
          std::operator+(&textNode,&local_d8,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_118);
          std::__cxx11::string::~string((string *)&issue_3);
          Issue::IssueImpl::setReferenceRule
                    ((IssueImpl *)
                     attribute.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     [1].mPimpl,XML_UNEXPECTED_ELEMENT);
        }
        AnyCellmlElement::AnyCellmlElementImpl::setVariable
                  ((AnyCellmlElementImpl *)
                   (attribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    [1].mPimpl[5].mXmlAttributePtr)->_private,variable);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)&attribute);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&attribute.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
    XmlNode::next((XmlNode *)&textNode);
    std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
  }
  XmlNode::firstAttribute((XmlNode *)&attribute);
  bVar5 = false;
  bVar4 = false;
  while (attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) {
    bVar6 = XmlAttribute::isType
                      (attribute.
                       super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,"name","");
    if (bVar6) {
      peVar2 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      XmlAttribute::value_abi_cxx11_
                (&textNode,
                 attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      NamedEntity::setName(&peVar2->super_NamedEntity,&textNode);
      std::__cxx11::string::~string((string *)&textNode);
      bVar5 = true;
    }
    else {
      bVar6 = isIdAttribute(&attribute,this->mParsing1XVersion);
      if (bVar6) {
        peVar2 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        XmlAttribute::value_abi_cxx11_
                  (&textNode,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        Entity::setId((Entity *)peVar2,&textNode);
        goto LAB_00200e3e;
      }
      bVar6 = XmlAttribute::isType
                        (attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"units","");
      if (bVar6) {
        pVVar3 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (this->mParsing1XVersion == true) {
          XmlAttribute::value_abi_cxx11_
                    (&local_d8,
                     attribute.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          convertNonSiUnits(&textNode,&local_d8);
          Variable::setUnits(pVVar3,&textNode);
          std::__cxx11::string::~string((string *)&textNode);
          this_00 = &local_d8;
        }
        else {
          XmlAttribute::value_abi_cxx11_
                    (&textNode,
                     attribute.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          Variable::setUnits(pVVar3,&textNode);
          this_00 = &textNode;
        }
        std::__cxx11::string::~string((string *)this_00);
        bVar4 = true;
        goto LAB_00200f0b;
      }
      bVar6 = XmlAttribute::isType
                        (attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"interface","");
      if (bVar6) {
        pVVar3 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        XmlAttribute::value_abi_cxx11_
                  (&textNode,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        Variable::setInterfaceType(pVVar3,&textNode);
      }
      else {
        bVar6 = XmlAttribute::isType
                          (attribute.
                           super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,"initial_value","");
        if (!bVar6) {
          bVar7 = this->mParsing1XVersion;
          if ((bool)bVar7 == true) {
            bVar6 = XmlAttribute::isType
                              (attribute.
                               super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,"public_interface","");
            if (!bVar6) {
              bVar7 = this->mParsing1XVersion;
              goto LAB_00200fb2;
            }
            bVar6 = Variable::hasInterfaceType
                              ((variable->
                               super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr,PRIVATE);
            interfaceType = bVar6 | PUBLIC;
LAB_00200fe7:
            Variable::setInterfaceType
                      ((variable->
                       super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                       interfaceType);
          }
          else {
LAB_00200fb2:
            if ((bVar7 & 1) != 0) {
              bVar6 = XmlAttribute::isType
                                (attribute.
                                 super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,"private_interface","");
              if (bVar6) {
                bVar6 = Variable::hasInterfaceType
                                  ((variable->
                                   super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr,PUBLIC);
                interfaceType = (uint)bVar6 * 2 + PRIVATE;
                goto LAB_00200fe7;
              }
            }
            Issue::IssueImpl::create();
            local_38 = (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl;
            if (this->mParsing1XVersion == true) {
              XmlNode::attribute_abi_cxx11_
                        ((string *)&issue_3,
                         (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,"name");
              std::operator+(&local_118,"Variable \'",(string *)&issue_3);
              std::operator+(&local_98,&local_118,"\' ignoring attribute \'");
              XmlAttribute::name_abi_cxx11_
                        (&local_58,
                         attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              std::operator+(&local_d8,&local_98,&local_58);
              std::operator+(&textNode,&local_d8,"\'.");
              Issue::IssueImpl::setDescription(local_38,&textNode);
              std::__cxx11::string::~string((string *)&textNode);
              std::__cxx11::string::~string((string *)&local_d8);
              std::__cxx11::string::~string((string *)&local_58);
              std::__cxx11::string::~string((string *)&local_98);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&issue_3);
              Issue::IssueImpl::setLevel
                        ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl,MESSAGE);
            }
            else {
              XmlNode::attribute_abi_cxx11_
                        ((string *)&issue_3,
                         (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,"name");
              std::operator+(&local_118,"Variable \'",(string *)&issue_3);
              std::operator+(&local_98,&local_118,"\' has an invalid attribute \'");
              XmlAttribute::name_abi_cxx11_
                        (&local_58,
                         attribute.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
              std::operator+(&local_d8,&local_98,&local_58);
              std::operator+(&textNode,&local_d8,"\'.");
              Issue::IssueImpl::setDescription(local_38,&textNode);
              std::__cxx11::string::~string((string *)&textNode);
              std::__cxx11::string::~string((string *)&local_d8);
              std::__cxx11::string::~string((string *)&local_58);
              std::__cxx11::string::~string((string *)&local_98);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&issue_3);
              Issue::IssueImpl::setReferenceRule
                        ((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl,VARIABLE_ATTRIBUTE_OPTIONAL);
            }
            AnyCellmlElement::AnyCellmlElementImpl::setVariable
                      ((((issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->mPimpl->mItem).
                        super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl,variable);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_2);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          goto LAB_00200f0b;
        }
        pVVar3 = (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        XmlAttribute::value_abi_cxx11_
                  (&textNode,
                   attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        Variable::setInitialValue(pVVar3,&textNode);
      }
LAB_00200e3e:
      std::__cxx11::string::~string((string *)&textNode);
    }
LAB_00200f0b:
    XmlAttribute::next((XmlAttribute *)&textNode);
    std::__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2> *)&textNode);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&textNode._M_string_length);
  }
  if ((bVar5) && (bVar4)) goto LAB_002013e6;
  Issue::IssueImpl::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&textNode,"Variable ",(allocator<char> *)&local_d8);
  if (bVar5) {
    XmlNode::attribute_abi_cxx11_
              (&local_118,
               (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               "name");
    std::operator+(&local_98,"\'",&local_118);
    std::operator+(&local_d8,&local_98,"\' does not specify a units attribute.");
    std::__cxx11::string::append((string *)&textNode);
LAB_00201348:
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_118);
  }
  else {
    if (bVar4) {
      XmlNode::attribute_abi_cxx11_
                (&local_118,
                 (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 "units");
      std::operator+(&local_98,"with units \'",&local_118);
      std::operator+(&local_d8,&local_98,"\' does not specify a name attribute.");
      std::__cxx11::string::append((string *)&textNode);
      goto LAB_00201348;
    }
    std::__cxx11::string::append((char *)&textNode);
  }
  Issue::IssueImpl::setDescription
            ((issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl,&textNode);
  Issue::IssueImpl::setReferenceRule
            ((issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl,VARIABLE_ATTRIBUTE_REQUIRED);
  AnyCellmlElement::AnyCellmlElementImpl::setVariable
            ((((issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl->mItem).
              super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl,variable);
  Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_3);
  std::__cxx11::string::~string((string *)&textNode);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_002013e6:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&attribute.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Parser::ParserImpl::loadVariable(const VariablePtr &variable, const XmlNodePtr &node)
{
    // A variable should not have any children.
    XmlNodePtr childNode = node->firstChild();
    while (childNode != nullptr) {
        if (childNode->isText()) {
            std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setVariable(variable);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' ignoring child element '" + childNode->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' has an invalid child element '" + childNode->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setVariable(variable);
            addIssue(issue);
        }
        childNode = childNode->next();
    }
    XmlAttributePtr attribute = node->firstAttribute();
    bool nameAttributePresent = false;
    bool unitsAttributePresent = false;
    while (attribute != nullptr) {
        if (attribute->isType("name")) {
            variable->setName(attribute->value());
            nameAttributePresent = true;
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            variable->setId(attribute->value());
        } else if (attribute->isType("units")) {
            if (mParsing1XVersion) {
                variable->setUnits(convertNonSiUnits(attribute->value()));
            } else {
                variable->setUnits(attribute->value());
            }
            unitsAttributePresent = true;
        } else if (attribute->isType("interface")) {
            variable->setInterfaceType(attribute->value());
        } else if (attribute->isType("initial_value")) {
            variable->setInitialValue(attribute->value());
        } else if (mParsing1XVersion && attribute->isType("public_interface")) {
            if (variable->hasInterfaceType(Variable::InterfaceType::PRIVATE)) {
                variable->setInterfaceType(Variable::InterfaceType::PUBLIC_AND_PRIVATE);
            } else {
                variable->setInterfaceType(Variable::InterfaceType::PUBLIC);
            }
        } else if (mParsing1XVersion && attribute->isType("private_interface")) {
            if (variable->hasInterfaceType(Variable::InterfaceType::PUBLIC)) {
                variable->setInterfaceType(Variable::InterfaceType::PUBLIC_AND_PRIVATE);
            } else {
                variable->setInterfaceType(Variable::InterfaceType::PRIVATE);
            }
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' ignoring attribute '" + attribute->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Variable '" + node->attribute("name") + "' has an invalid attribute '" + attribute->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_ATTRIBUTE_OPTIONAL);
            }
            issue->mPimpl->mItem->mPimpl->setVariable(variable);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!nameAttributePresent || !unitsAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        std::string description = "Variable ";
        if (nameAttributePresent) {
            description += "'" + node->attribute("name") + "' does not specify a units attribute.";
        } else if (unitsAttributePresent) {
            description += "with units '" + node->attribute("units") + "' does not specify a name attribute.";
        } else {
            description += "does not specify a name attribute or a units attribute.";
        }

        issue->mPimpl->setDescription(description);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::VARIABLE_ATTRIBUTE_REQUIRED);
        issue->mPimpl->mItem->mPimpl->setVariable(variable);
        addIssue(issue);
    }
}